

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O0

void Abc_NtkChangePerform(Abc_Ntk_t *pNtk,int fVerbose)

{
  int iVar1;
  int iVar2;
  Mio_Cell2_t *pCells_00;
  Vec_Int_t *vInfo_00;
  Vec_Int_t *vFirst_00;
  Vec_Ptr_t *vFanout_00;
  Vec_Ptr_t *vFanout2_00;
  Vec_Int_t *vTemp_00;
  Abc_Obj_t *pObj_00;
  abctime aVar3;
  float fVar4;
  Abc_Obj_t *pObj;
  Vec_Int_t *vTemp;
  Vec_Ptr_t *vFanout2;
  Vec_Ptr_t *vFanout;
  Vec_Int_t *vFirst;
  Vec_Int_t *vInfo;
  Mio_Cell2_t *pCells;
  uint local_38;
  int CountInv;
  int Count;
  int GainAll;
  int Gain;
  int nCells;
  int fNeedInv;
  int i;
  abctime clk;
  Abc_Ntk_t *pAStack_10;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  clk._4_4_ = fVerbose;
  pAStack_10 = pNtk;
  _fNeedInv = Abc_Clock();
  CountInv = 0;
  local_38 = 0;
  pCells._4_4_ = 0;
  pCells_00 = Mio_CollectRootsNewDefault2(6,&GainAll,0);
  vInfo_00 = Abc_NtkPrecomputeCellPairs(pCells_00,GainAll);
  vFirst_00 = Abc_NtkPrecomputeFirsts(pCells_00,GainAll);
  vFanout_00 = Vec_PtrAlloc(100);
  vFanout2_00 = Vec_PtrAlloc(100);
  vTemp_00 = Vec_IntAlloc(100);
  for (nCells = 0; iVar2 = nCells, iVar1 = Vec_PtrSize(pAStack_10->vObjs), iVar2 < iVar1;
      nCells = nCells + 1) {
    pObj_00 = Abc_NtkObj(pAStack_10,nCells);
    if ((((pObj_00 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pObj_00), iVar2 != 0)) &&
        ((iVar2 = Abc_ObjFaninNum(pObj_00), 1 < iVar2 ||
         (iVar2 = Abc_NodeIsInv(pObj_00), iVar2 != 0)))) &&
       ((iVar2 = Abc_ObjHasDupFanouts(pObj_00), iVar2 == 0 &&
        (iVar2 = Abc_ObjChangeEval(pObj_00,vInfo_00,vFirst_00,(int)pCells_00[3].AreaW,&Gain),
        0 < iVar2)))) {
      local_38 = local_38 + 1;
      iVar1 = Abc_NodeIsInv(pObj_00);
      pCells._4_4_ = iVar1 + pCells._4_4_;
      CountInv = iVar2 + CountInv;
      Abc_ObjChangePerform
                (pObj_00,vInfo_00,vFirst_00,Gain,vTemp_00,vFanout_00,vFanout2_00,pCells_00);
    }
  }
  Vec_PtrFree(vFanout2_00);
  Vec_PtrFree(vFanout_00);
  Vec_IntFree(vTemp_00);
  Vec_IntFree(vFirst_00);
  Vec_IntFree(vInfo_00);
  if (pCells_00 != (Mio_Cell2_t *)0x0) {
    free(pCells_00);
  }
  if (clk._4_4_ != 0) {
    fVar4 = Scl_Int2Flt(CountInv);
    printf("Total gain in area = %6.2f after %d changes (including %d inverters). ",(double)fVar4,
           (ulong)local_38,(ulong)pCells._4_4_);
  }
  if (clk._4_4_ != 0) {
    aVar3 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar3 - _fNeedInv);
  }
  return;
}

Assistant:

void Abc_NtkChangePerform( Abc_Ntk_t * pNtk, int fVerbose )
{
    abctime clk = Abc_Clock();
    int i, fNeedInv, nCells, Gain, GainAll = 0, Count = 0, CountInv = 0;
    Mio_Cell2_t * pCells = Mio_CollectRootsNewDefault2( 6, &nCells, 0 );
    Vec_Int_t * vInfo = Abc_NtkPrecomputeCellPairs( pCells, nCells );
    Vec_Int_t * vFirst = Abc_NtkPrecomputeFirsts( pCells, nCells );

    Vec_Ptr_t * vFanout = Vec_PtrAlloc( 100 );
    Vec_Ptr_t * vFanout2 = Vec_PtrAlloc( 100 );
    Vec_Int_t * vTemp = Vec_IntAlloc( 100 );
    Abc_Obj_t * pObj;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( Abc_ObjFaninNum(pObj) < 2 && !Abc_NodeIsInv(pObj) )
            continue;
        if ( Abc_ObjHasDupFanouts(pObj) )
            continue;
        Gain = Abc_ObjChangeEval( pObj, vInfo, vFirst, (int)pCells[3].AreaW, &fNeedInv );
        if ( Gain <= 0 )
            continue;
        //printf( "Obj %d\n", Abc_ObjId(pObj) );
        Count++;
        CountInv += Abc_NodeIsInv(pObj);
        GainAll += Gain;
        Abc_ObjChangePerform( pObj, vInfo, vFirst, fNeedInv, vTemp, vFanout, vFanout2, pCells );
    }
    Vec_PtrFree( vFanout2 );
    Vec_PtrFree( vFanout );
    Vec_IntFree( vTemp );

    Vec_IntFree( vFirst );
    Vec_IntFree( vInfo );
    ABC_FREE( pCells );

    if ( fVerbose )
        printf( "Total gain in area = %6.2f after %d changes (including %d inverters). ", Scl_Int2Flt(GainAll), Count, CountInv );
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}